

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MeshDenoisingBase.cpp
# Opt level: O1

double __thiscall
MeshDenoisingBase::getMeanSquareAngleError
          (MeshDenoisingBase *this,TriMesh *DenoisedMesh,TriMesh *OriginalMesh)

{
  value_handle _idx;
  PropertyT<OpenMesh::VectorT<double,_3>_> *pPVar1;
  const_reference pvVar2;
  undefined8 uVar3;
  BaseHandle _idx_00;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  FaceIter FVar7;
  undefined1 local_60 [8];
  FaceIter f_it2;
  undefined1 local_48 [8];
  FaceIter f_it1;
  
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             DenoisedMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)DenoisedMesh);
  OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
  request_face_normals
            ((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity> *)
             OriginalMesh);
  OpenMesh::
  PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  ::update_face_normals
            ((PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
              *)OriginalMesh);
  _local_48 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)DenoisedMesh);
  _local_60 = OpenMesh::PolyConnectivity::faces_begin((PolyConnectivity *)OriginalMesh);
  FVar7 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
  f_it1.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
  f_it1.skip_bits_ = 0;
  if (f_it1.mesh_._0_4_ != (BaseHandle)FVar7.hnd_.super_BaseHandle.idx_ ||
      local_48 != (undefined1  [8])FVar7.mesh_) {
    f_it1.hnd_.super_BaseHandle.idx_ = (BaseHandle)0x0;
    f_it1.skip_bits_ = 0;
    _idx_00 = f_it1.mesh_._0_4_;
    do {
      pPVar1 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                         ((PropertyContainer *)
                          &(DenoisedMesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .field_0x68,
                          (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                          (DenoisedMesh->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                          super_BaseHandle.idx_);
      pvVar2 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[](pPVar1,_idx_00.idx_);
      dVar5 = (pvVar2->super_VectorDataT<double,_3>).values_[0];
      dVar4 = (pvVar2->super_VectorDataT<double,_3>).values_[1];
      f_it2._8_8_ = (pvVar2->super_VectorDataT<double,_3>).values_[2];
      _idx.super_BaseHandle.idx_ = f_it2.mesh_._0_4_;
      pPVar1 = OpenMesh::PropertyContainer::property<OpenMesh::VectorT<double,3>>
                         ((PropertyContainer *)
                          &(OriginalMesh->super_Mesh).
                           super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                           .
                           super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                           .field_0x68,
                          (BasePropHandleT<OpenMesh::VectorT<double,_3>_>)
                          (OriginalMesh->super_Mesh).
                          super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                          .
                          super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                          .face_normals_.super_BasePropHandleT<OpenMesh::VectorT<double,_3>_>.
                          super_BaseHandle.idx_);
      pvVar2 = OpenMesh::PropertyT<OpenMesh::VectorT<double,_3>_>::operator[]
                         (pPVar1,(int)_idx.super_BaseHandle.idx_);
      dVar4 = (double)f_it2._8_8_ * (pvVar2->super_VectorDataT<double,_3>).values_[2] +
              dVar4 * (pvVar2->super_VectorDataT<double,_3>).values_[1] +
              dVar5 * (pvVar2->super_VectorDataT<double,_3>).values_[0] + 0.0;
      dVar5 = -1.0;
      if (-1.0 <= dVar4) {
        dVar5 = dVar4;
      }
      if (1.0 <= dVar5) {
        dVar5 = 1.0;
      }
      dVar5 = acos(dVar5);
      f_it1.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it1.mesh_._0_4_ + 1);
      f_it2._8_8_ = (dVar5 * 180.0) / 3.141592653589793;
      if (f_it1.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_48);
      }
      f_it2.mesh_._0_4_ = (BaseHandle)(BaseHandle)((int)f_it2.mesh_._0_4_ + 1);
      if (f_it2.mesh_._4_4_ != 0) {
        OpenMesh::Iterators::
        GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
        ::skip_fwd((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::FaceHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_face_status,_&OpenMesh::ArrayKernel::n_faces>
                    *)local_60);
      }
      f_it1._8_8_ = (double)f_it1._8_8_ + (double)f_it2._8_8_;
      FVar7 = OpenMesh::PolyConnectivity::faces_end((PolyConnectivity *)DenoisedMesh);
      _idx_00 = f_it1.mesh_._0_4_;
    } while (f_it1.mesh_._0_4_ != (BaseHandle)FVar7.hnd_.super_BaseHandle.idx_ ||
             local_48 != (undefined1  [8])FVar7.mesh_);
  }
  uVar3 = (**(code **)(*(long *)&(DenoisedMesh->super_Mesh).
                                 super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
                                 .
                                 super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                      + 0x28))(DenoisedMesh);
  auVar6._8_4_ = (int)((ulong)uVar3 >> 0x20);
  auVar6._0_8_ = uVar3;
  auVar6._12_4_ = 0x45300000;
  return (double)f_it1._8_8_ /
         ((auVar6._8_8_ - 1.9342813113834067e+25) +
         ((double)CONCAT44(0x43300000,(int)uVar3) - 4503599627370496.0));
}

Assistant:

double MeshDenoisingBase::getMeanSquareAngleError(TriMesh &DenoisedMesh, TriMesh &OriginalMesh)
{
    DenoisedMesh.request_face_normals();
    DenoisedMesh.update_face_normals();

    OriginalMesh.request_face_normals();
    OriginalMesh.update_face_normals();

    double mean_square_angle_error = 0.0;
    for (TriMesh::FaceIter f_it1 = DenoisedMesh.faces_begin(), f_it2 = OriginalMesh.faces_begin();
        f_it1 != DenoisedMesh.faces_end(); f_it1++, f_it2++ )
    {
        TriMesh::Normal normal1 = DenoisedMesh.normal(*f_it1);
        TriMesh::Normal normal2 = OriginalMesh.normal(*f_it2);
        double cross_value = normal1 | normal2;
        cross_value = std::min(1.0, std::max(cross_value, -1.0));
        mean_square_angle_error += std::acos(cross_value) * 180.0 / M_PI;
    }

    return mean_square_angle_error / (double)DenoisedMesh.n_faces();
}